

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O2

void mcpl_update_nparticles(FILE *f,uint64_t n)

{
  int iVar1;
  long __off;
  size_t sVar2;
  uint64_t n_local;
  
  n_local = n;
  __off = ftell((FILE *)f);
  if (-1 < __off) {
    iVar1 = fseek((FILE *)f,8,0);
    if (iVar1 == 0) {
      sVar2 = fwrite(&n_local,1,8,(FILE *)f);
      if (sVar2 == 8) {
        iVar1 = fseek((FILE *)f,__off,0);
        if (iVar1 == 0) {
          return;
        }
      }
    }
  }
  mcpl_error("Errors encountered while attempting to update number of particles in file.");
}

Assistant:

MCPL_LOCAL void mcpl_update_nparticles(FILE* f, uint64_t n)
{
  //Seek and update nparticles at correct location in header:
  const char * errmsg = ( "Errors encountered while attempting "
                          "to update number of particles in file." );
  int64_t savedpos = MCPL_FTELL(f);
  if (savedpos<0)
    mcpl_error(errmsg);
  if (MCPL_FSEEK( f, MCPLIMP_NPARTICLES_POS ))
    mcpl_error(errmsg);
  size_t nb = fwrite(&n, 1, sizeof(n), f);
  if (nb != sizeof(n))
    mcpl_error(errmsg);
  if (MCPL_FSEEK( f, savedpos ))
    mcpl_error(errmsg);
}